

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

void __thiscall
iDynTree::KinDynComputations::computeRawMassMatrixAndTotalMomentum(KinDynComputations *this)

{
  long lVar1;
  byte bVar2;
  JointPosDoubleArray *pJVar3;
  KinDynComputations *this_00;
  long in_RDI;
  bool ok;
  
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x328) & 1) == 0) {
    lVar1 = *(long *)(in_RDI + 8);
    this_00 = (KinDynComputations *)(*(long *)(in_RDI + 8) + 0x138);
    pJVar3 = (JointPosDoubleArray *)iDynTree::FreeFloatingPos::jointPos();
    bVar2 = iDynTree::CompositeRigidBodyAlgorithm
                      ((Model *)(lVar1 + 8),(Traversal *)this_00,pJVar3,
                       (LinkInertias *)(*(long *)(in_RDI + 8) + 0x330),
                       (FreeFloatingMassMatrix *)(*(long *)(in_RDI + 8) + 0x3a8));
    iDynTree::reportErrorIf
              ((bool)((bVar2 & 1 ^ 0xff) & 1),"KinDynComputations::computeRawMassMatrix",
               "Error in computing mass matrix.");
    computeFwdKinematics(this_00);
    iDynTree::ComputeLinearAndAngularMomentum
              ((Model *)(*(long *)(in_RDI + 8) + 8),(LinkPositions *)(*(long *)(in_RDI + 8) + 0x2f8)
               ,(LinkVelArray *)(*(long *)(in_RDI + 8) + 0x310),
               (SpatialMomentum *)(*(long *)(in_RDI + 8) + 0x3d0));
    *(byte *)(*(long *)(in_RDI + 8) + 0x328) = bVar2 & 1;
  }
  return;
}

Assistant:

void KinDynComputations::computeRawMassMatrixAndTotalMomentum()
{
    if( this->pimpl->m_isRawMassMatrixUpdated )
    {
        return;
    }

    // Compute raw mass matrix
    bool ok = CompositeRigidBodyAlgorithm(pimpl->m_robot_model,
                                          pimpl->m_traversal,
                                          pimpl->m_pos.jointPos(),
                                          pimpl->m_linkCRBIs,
                                          pimpl->m_rawMassMatrix);

    reportErrorIf(!ok,"KinDynComputations::computeRawMassMatrix","Error in computing mass matrix.");


    // m_linkPos and m_linkVel are used in the computation of the total momentum
    // so we need to make sure that they are updated
    this->computeFwdKinematics();

    // Compute total momentum
    ComputeLinearAndAngularMomentum(pimpl->m_robot_model,
                                    pimpl->m_linkPos,
                                    pimpl->m_linkVel,
                                    pimpl->m_totalMomentum);

    this->pimpl->m_isRawMassMatrixUpdated = ok;
}